

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:670:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:670:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  global_object *this_00;
  object *poVar6;
  uint *puVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  undefined8 extraout_RDX_02;
  uint k;
  pointer pvVar9;
  value *pvVar10;
  long lVar11;
  gc_heap *this_01;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  object_ptr o;
  wstring is;
  uint32_t len;
  value callback;
  value kval;
  value this_arg;
  value res;
  allocator_type local_1e9;
  gc_heap_ptr_untyped local_1e8;
  undefined1 local_1d8 [32];
  slot *local_1b8;
  gc_heap_ptr_untyped local_1b0;
  uint32_t local_19c;
  gc_heap_ptr_untyped local_198;
  value local_188;
  undefined4 local_160;
  double local_158;
  slot local_138;
  gc_heap_ptr_untyped local_130 [2];
  value *local_110;
  gc_heap *local_108;
  anon_class_24_3_2ec80dac local_100;
  value local_e8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_c0;
  value local_a8;
  value local_80;
  value local_58;
  
  local_110 = __return_storage_ptr__;
  make_array((gc_heap_ptr<mjs::global_object> *)&local_198,(int)this + 8);
  local_19c = 0;
  local_1b0.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_1b0.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  if (local_1b0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_1b0.heap_,&local_1b0);
  }
  local_100.len = &local_19c;
  local_100.this_ = this_;
  local_100.a = (object_ptr *)&local_198;
  plVar4 = (long *)gc_heap_ptr_untyped::get(&local_1b0);
  (**(code **)(*plVar4 + 0x88))(&local_1e8,plVar4,this_);
  puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1e8);
  local_e8.type_ = reference;
  local_e8._4_4_ = 0;
  local_e8.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x196194;
  (**(code **)*puVar5)(&local_188,puVar5);
  uVar2 = to_uint32(&local_188);
  value::destroy(&local_188);
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar9 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar9 = (pointer)&value::undefined;
  }
  value::value(&local_e8,pvVar9);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&local_1b0);
  plVar4 = (long *)gc_heap_ptr_untyped::get(&local_1b0);
  (**(code **)(*plVar4 + 0x60))(&local_188,plVar4);
  global_object::validate_type(this_00,&local_e8,(object_ptr *)&local_188,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_188);
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) * -0x3333333333333333) <
      2) {
    pvVar10 = (value *)&value::undefined;
  }
  else {
    pvVar10 = pvVar9 + 1;
  }
  value::value(&local_80,pvVar10);
  if (uVar2 < 0x10000) {
    if (uVar2 != 0) {
      k = 0;
      uVar8 = extraout_RDX;
      do {
        index_string_abi_cxx11_((wstring *)local_1d8,(mjs *)(ulong)k,(uint32_t)uVar8);
        poVar6 = (object *)gc_heap_ptr_untyped::get(&local_1e8);
        local_188._0_8_ = local_1d8._8_8_;
        local_188.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_1d8._0_8_;
        bVar1 = object::has_property(poVar6,(wstring_view *)&local_188);
        uVar8 = extraout_RDX_00;
        if (bVar1) {
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1e8);
          local_188._0_8_ = local_1d8._8_8_;
          local_188.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_1d8._0_8_;
          (**(code **)*puVar5)(&local_a8,puVar5,&local_188);
          value::value(&local_188,&local_a8);
          local_158 = (double)(int)k;
          local_160 = 3;
          local_138.new_position = 5;
          local_130[0].heap_ = local_1e8.heap_;
          local_130[0].pos_ = local_1e8.pos_;
          if (local_1e8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1e8.heap_,local_130);
          }
          __l._M_len = 3;
          __l._M_array = &local_188;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l,&local_1e9);
          call_function(&local_58,&local_e8,&local_80,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar11 = 0x50;
          do {
            value::destroy((value *)((long)&local_188.type_ + lVar11));
            lVar11 = lVar11 + -0x28;
          } while (lVar11 != -0x28);
          anon_unknown_110::array_filter::anon_class_24_3_2ec80dac::operator()
                    (&local_100,k,&local_58);
          value::destroy(&local_58);
          value::destroy(&local_a8);
          uVar8 = extraout_RDX_01;
        }
        if ((gc_heap *)local_1d8._0_8_ != (gc_heap *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ * 4 + 4);
          uVar8 = extraout_RDX_02;
        }
        k = k + 1;
      } while (k != uVar2);
    }
  }
  else {
    poVar6 = (object *)gc_heap_ptr_untyped::get(&local_1e8);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1d8,poVar6);
    local_108 = (gc_heap *)local_1d8._8_8_;
    if (local_1d8._0_8_ != local_1d8._8_8_) {
      local_1b8 = &local_138;
      this_01 = (gc_heap *)local_1d8._0_8_;
      do {
        puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
        local_188.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar7 + 1);
        local_188._0_8_ = ZEXT48(*puVar7);
        uVar2 = index_value_from_string((wstring_view *)&local_188);
        if (uVar2 == 0xffffffff) {
          iVar3 = 6;
        }
        else {
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1e8);
          puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
          local_188.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar7 + 1);
          local_188._0_8_ = ZEXT48(*puVar7);
          (**(code **)*puVar5)(&local_a8,puVar5,&local_188);
          value::value(&local_188,&local_a8);
          local_158 = (double)uVar2;
          local_160 = 3;
          local_138.new_position = 5;
          local_130[0].heap_ = local_1e8.heap_;
          local_130[0].pos_ = local_1e8.pos_;
          if (local_1e8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1e8.heap_,local_130);
          }
          __l_00._M_len = 3;
          __l_00._M_array = &local_188;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l_00,&local_1e9);
          call_function(&local_58,&local_e8,&local_80,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar11 = 0x50;
          do {
            value::destroy((value *)((long)&local_188.type_ + lVar11));
            lVar11 = lVar11 + -0x28;
          } while (lVar11 != -0x28);
          anon_unknown_110::array_filter::anon_class_24_3_2ec80dac::operator()
                    (&local_100,uVar2,&local_58);
          value::destroy(&local_58);
          value::destroy(&local_a8);
          iVar3 = 0;
        }
      } while (((iVar3 == 6) || (iVar3 == 0)) &&
              (this_01 = (gc_heap *)&this_01->alloc_context_, this_01 != local_108));
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1d8);
  }
  value::destroy(&local_80);
  value::destroy(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1b0);
  pvVar10 = local_110;
  local_110->type_ = object;
  (local_110->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       local_198.heap_;
  *(uint32_t *)((long)&local_110->field_1 + 8) = local_198.pos_;
  if (local_198.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_198.heap_,(gc_heap_ptr_untyped *)&(local_110->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_198);
  return pvVar10;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }